

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
anon_unknown.dwarf_3eca4::updateNames::NameMapper::create(NameMapper *this)

{
  KindNameUpdates *kindNameUpdates;
  NameMapper *this_00;
  long in_RSI;
  
  kindNameUpdates = *(KindNameUpdates **)(in_RSI + 0x130);
  this_00 = (NameMapper *)operator_new(0x138);
  (anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::
  unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
  allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::
  equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::
  unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
  allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper::NameMapper(std::
  unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::
  Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::
  hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::
  ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::
  equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>_>_>_>_>_>__
            (this_00,kindNameUpdates);
  (this->
  super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
      return std::make_unique<NameMapper>(kindNameUpdates);
    }